

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O1

int64_t util::parse(char *s)

{
  char *pcVar1;
  char cVar2;
  char cVar3;
  long lVar4;
  invalid_argument *this;
  size_t sVar5;
  overflow_error *this_00;
  long lVar6;
  code *pcVar7;
  undefined *puVar8;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  if ((s == (char *)0x0) || (cVar2 = *s, cVar2 == '\0')) {
    this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument
              ((invalid_argument *)this_00,"null or empty string argument");
    puVar8 = &std::invalid_argument::typeinfo;
    pcVar7 = std::invalid_argument::~invalid_argument;
  }
  else {
    __s = s + ((cVar2 - 0x2bU & 0xfd) == 0);
    lVar6 = 0;
    cVar3 = *__s;
    while (cVar3 != '\0') {
      if ((byte)(cVar3 - 0x3aU) < 0xf6) {
        this = (invalid_argument *)__cxa_allocate_exception(0x10);
        local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_68,"invalid input string","");
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        sVar5 = strlen(__s);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,__s,__s + sVar5);
        std::operator+(&local_48,&local_68,&local_88);
        std::invalid_argument::invalid_argument(this,(string *)&local_48);
        __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
      }
      lVar6 = (lVar6 * 10 - (long)cVar3) + 0x30;
      if (0 < lVar6) {
        this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
        std::overflow_error::overflow_error(this_00,"overflow occured when parsing");
        goto LAB_0010518d;
      }
      pcVar1 = __s + 1;
      __s = __s + 1;
      cVar3 = *pcVar1;
    }
    lVar4 = -lVar6;
    if (cVar2 == '-') {
      lVar4 = lVar6;
    }
    if (lVar4 < 0 == (cVar2 == '-') || lVar6 == 0) {
      return lVar4;
    }
    this_00 = (overflow_error *)__cxa_allocate_exception(0x10);
    std::overflow_error::overflow_error(this_00,"overflow occured when parsing");
LAB_0010518d:
    puVar8 = &std::overflow_error::typeinfo;
    pcVar7 = std::overflow_error::~overflow_error;
  }
  __cxa_throw(this_00,puVar8,pcVar7);
}

Assistant:

std::int64_t parse(const char* s)
{
	if (s == nullptr || *s == '\0')
		throw std::invalid_argument("null or empty string argument");

	bool negative = (s[0] == '-');
	if (*s == '+' || *s == '-')
		++s;

	std::int64_t ret = 0;
	while (*s)
	{
		ret = ret * 10 - (*s - '0'); // assume negative since |min| >= |max|

		if (*s < '0' || *s > '9')
			throw std::invalid_argument(std::string("invalid input string") + std::string(s));

		if (ret > 0)
			throw std::overflow_error("overflow occured when parsing");

		++s;
	}
	ret = negative ? ret : -ret;
	if (negative != (ret < 0) && ret != 0)
		throw std::overflow_error("overflow occured when parsing");

	return ret;
}